

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrROL0x26(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  byte bVar1;
  byte bVar2;
  byte value;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this->m,addr);
  this_00 = this->m;
  bVar2 = Memory::Read8(this_00,(ushort)bVar1);
  value = (byte)this->field_0x2e >> 7 | bVar2 * '\x02';
  this->field_0x2e =
       (byte)(bVar2 * '\x02') >> 7 | bVar2 & 0x80 | this->field_0x2e & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,(ushort)bVar1,value);
  return 5;
}

Assistant:

int CPU::instrROL0x26() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, ROL(m->Read8(address)));
	return 5;
}